

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

JavascriptAsyncGeneratorFunction * __thiscall
Js::JavascriptLibrary::CreateAsyncGeneratorFunction
          (JavascriptLibrary *this,JavascriptMethod entryPoint,
          GeneratorVirtualScriptFunction *scriptFunction)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DynamicType *type;
  Recycler *recycler;
  JavascriptAsyncGeneratorFunction *this_00;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  if (((((this->super_JavascriptLibraryBase).scriptContext.ptr)->config).threadConfig)->
      m_ES2018AsyncIteration == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x199b,
                                "(scriptContext->GetConfig()->IsES2018AsyncIterationEnabled())",
                                "scriptContext->GetConfig()->IsES2018AsyncIterationEnabled()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  bVar2 = (bool)(**(code **)((long)(scriptFunction->super_ScriptFunction).super_ScriptFunctionBase.
                                   super_JavascriptFunction.super_DynamicObject.
                                   super_RecyclableObject.super_FinalizableObject.
                                   super_IRecyclerVisitedObject + 0x3b8))(scriptFunction);
  type = CreateDeferredPrototypeAsyncGeneratorFunctionType(this,entryPoint,bVar2,false);
  local_58 = (undefined1  [8])&JavascriptAsyncGeneratorFunction::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_74a5554;
  data.filename._0_4_ = 0x199f;
  recycler = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_58);
  this_00 = (JavascriptAsyncGeneratorFunction *)
            new<(Memory::ObjectInfoBits)1>
                      (0x38,recycler,(InfoBitsWrapper<(Memory::ObjectInfoBits)1> *)&data.field_0x27)
  ;
  JavascriptAsyncGeneratorFunction::JavascriptAsyncGeneratorFunction(this_00,type,scriptFunction);
  return this_00;
}

Assistant:

JavascriptAsyncGeneratorFunction* JavascriptLibrary::CreateAsyncGeneratorFunction(JavascriptMethod entryPoint, GeneratorVirtualScriptFunction* scriptFunction)
    {
        Assert(scriptContext->GetConfig()->IsES2018AsyncIterationEnabled());

        DynamicType* type = CreateDeferredPrototypeAsyncGeneratorFunctionType(entryPoint, scriptFunction->IsAnonymousFunction());

        return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, JavascriptAsyncGeneratorFunction, type, scriptFunction);
    }